

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

int Minisat::parseInt<Minisat::StreamBuffer>(StreamBuffer *in)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  uint uVar4;
  int local_2c;
  int local_14;
  bool neg;
  int val;
  StreamBuffer *in_local;
  
  local_14 = 0;
  bVar2 = false;
  skipWhitespace<Minisat::StreamBuffer>(in);
  iVar3 = StreamBuffer::operator*(in);
  if (iVar3 == 0x2d) {
    bVar2 = true;
    StreamBuffer::operator++(in);
  }
  else {
    iVar3 = StreamBuffer::operator*(in);
    if (iVar3 == 0x2b) {
      StreamBuffer::operator++(in);
    }
  }
  iVar3 = StreamBuffer::operator*(in);
  if ((0x2f < iVar3) && (iVar3 = StreamBuffer::operator*(in), iVar3 < 0x3a)) {
    while( true ) {
      iVar3 = StreamBuffer::operator*(in);
      bVar1 = false;
      if (0x2f < iVar3) {
        iVar3 = StreamBuffer::operator*(in);
        bVar1 = iVar3 < 0x3a;
      }
      if (!bVar1) break;
      iVar3 = StreamBuffer::operator*(in);
      local_14 = local_14 * 10 + iVar3 + -0x30;
      StreamBuffer::operator++(in);
    }
    if (bVar2) {
      local_2c = -local_14;
    }
    else {
      local_2c = local_14;
    }
    return local_2c;
  }
  __stream = _stderr;
  uVar4 = StreamBuffer::operator*(in);
  fprintf(__stream,"PARSE ERROR! Unexpected char: %c\n",(ulong)uVar4);
  exit(3);
}

Assistant:

static int parseInt(B& in) {
    int     val = 0;
    bool    neg = false;
    skipWhitespace(in);
    if      (*in == '-') neg = true, ++in;
    else if (*in == '+') ++in;
    if (*in < '0' || *in > '9') fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
    while (*in >= '0' && *in <= '9')
        val = val*10 + (*in - '0'),
        ++in;
    return neg ? -val : val; }